

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

QStyleOptionViewItem * __thiscall
QItemDelegate::setOptions(QItemDelegate *this,QModelIndex *index,QStyleOptionViewItem *option)

{
  bool bVar1;
  QStyleOptionViewItem *in_RDI;
  long in_FS_OFFSET;
  QStyleOptionViewItem *opt;
  QVariant value;
  undefined4 in_stack_ffffffffffffff18;
  ColorRole in_stack_ffffffffffffff1c;
  QStyleOptionViewItem *in_stack_ffffffffffffff20;
  QStyleOptionViewItem *pQVar2;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 uVar3;
  byte bVar4;
  QBrush local_a0 [12];
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_94;
  QFontMetrics local_90 [8];
  QFont local_88 [16];
  QFont local_78 [16];
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  pQVar2 = in_RDI;
  memset(in_RDI,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem
            (in_stack_ffffffffffffff20,
             (QStyleOptionViewItem *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QModelIndex *)CONCAT17(uVar3,in_stack_ffffffffffffff38),
                    (int)((ulong)pQVar2 >> 0x20));
  bVar1 = ::QVariant::isValid((QVariant *)in_stack_ffffffffffffff20);
  if (bVar1) {
    qvariant_cast<QFont>((QVariant *)CONCAT17(uVar3,in_stack_ffffffffffffff38));
    QFont::resolve(local_78);
    QFont::operator=((QFont *)in_stack_ffffffffffffff20,
                     (QFont *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QFont::~QFont(local_78);
    QFont::~QFont(local_88);
    QFontMetrics::QFontMetrics(local_90,&pQVar2->font);
    QFontMetrics::operator=
              ((QFontMetrics *)in_stack_ffffffffffffff20,
               (QFontMetrics *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QFontMetrics::~QFontMetrics(local_90);
  }
  QModelIndex::data((QModelIndex *)CONCAT17(uVar3,in_stack_ffffffffffffff38),
                    (int)((ulong)pQVar2 >> 0x20));
  ::QVariant::operator=((QVariant *)in_RDI,(QVariant *)in_stack_ffffffffffffff20);
  ::QVariant::~QVariant(&local_48);
  bVar1 = ::QVariant::isValid((QVariant *)in_stack_ffffffffffffff20);
  if (bVar1) {
    local_94.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QtPrivate::legacyFlagValueFromModelData<QFlags<Qt::AlignmentFlag>>
                   ((QVariant *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    (pQVar2->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (Int)local_94.super_QFlagsStorage<Qt::AlignmentFlag>.i;
  }
  QModelIndex::data((QModelIndex *)CONCAT17(uVar3,in_stack_ffffffffffffff38),
                    (int)((ulong)pQVar2 >> 0x20));
  ::QVariant::operator=((QVariant *)in_RDI,(QVariant *)in_stack_ffffffffffffff20);
  ::QVariant::~QVariant(&local_68);
  bVar1 = ::QVariant::canConvert<QBrush>((QVariant *)in_stack_ffffffffffffff20);
  if (bVar1) {
    in_stack_ffffffffffffff20 = (QStyleOptionViewItem *)&(pQVar2->super_QStyleOption).palette;
    qvariant_cast<QBrush>((QVariant *)CONCAT17(uVar3,in_stack_ffffffffffffff38));
    QPalette::setBrush((QPalette *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       (QBrush *)0x851dc5);
    QBrush::~QBrush(local_a0);
  }
  (pQVar2->super_QStyleOption).styleObject = (QObject *)0x0;
  bVar4 = 1;
  ::QVariant::~QVariant((QVariant *)&local_28);
  if ((bVar4 & 1) == 0) {
    QStyleOptionViewItem::~QStyleOptionViewItem(in_stack_ffffffffffffff20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStyleOptionViewItem QItemDelegate::setOptions(const QModelIndex &index,
                                               const QStyleOptionViewItem &option) const
{
    QStyleOptionViewItem opt = option;

    // set font
    QVariant value = index.data(Qt::FontRole);
    if (value.isValid()){
        opt.font = qvariant_cast<QFont>(value).resolve(opt.font);
        opt.fontMetrics = QFontMetrics(opt.font);
    }

    // set text alignment
    value = index.data(Qt::TextAlignmentRole);
    if (value.isValid())
        opt.displayAlignment = QtPrivate::legacyFlagValueFromModelData<Qt::Alignment>(value);

    // set foreground brush
    value = index.data(Qt::ForegroundRole);
    if (value.canConvert<QBrush>())
        opt.palette.setBrush(QPalette::Text, qvariant_cast<QBrush>(value));

    // disable style animations for checkboxes etc. within itemviews (QTBUG-30146)
    opt.styleObject = nullptr;

    return opt;
}